

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitMADPDiscrete::GetActionObservationHistoryArrays
          (PlanningUnitMADPDiscrete *this,Index agentI,Index aohI,Index t,Index *aIs,Index *oIs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Index IVar3;
  Index IVar4;
  const_reference pvVar5;
  size_t nrO_00;
  size_t nrA_00;
  ulong uVar6;
  uint in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar7 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var_01 [56];
  undefined1 auVar8 [64];
  Index aoI_t2;
  size_t b;
  size_t stage;
  Index t2;
  size_t nrAO;
  size_t nrA;
  size_t nrO;
  size_t vec_size;
  Index remainder;
  Index aohIwithinThisT;
  undefined4 in_stack_ffffffffffffff78;
  Index in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 local_54;
  undefined4 local_30;
  undefined1 extraout_var_00 [56];
  
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::at((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
        *)CONCAT44(in_EDX,in_stack_ffffffffffffff80),
       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                      CONCAT44(in_EDX,in_stack_ffffffffffffff80),
                      CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  IVar3 = Globals::CastLIndexToIndex(*pvVar5);
  local_30 = in_EDX - IVar3;
  nrO_00 = GetNrObservations((PlanningUnitMADPDiscrete *)CONCAT44(in_EDX,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff7c);
  nrA_00 = (**(code **)(*in_RDI + 0x38))(in_RDI,in_ESI);
  auVar8._8_56_ = extraout_var_01;
  auVar8._0_8_ = extraout_XMM1_Qa;
  auVar7._8_56_ = extraout_var;
  auVar7._0_8_ = (double)extraout_XMM0_Qa;
  for (local_54 = 0; local_54 < in_ECX; local_54 = local_54 + 1) {
    auVar1 = vcvtusi2sd_avx512f(auVar7._0_16_,nrO_00 * nrA_00);
    auVar2 = vcvtusi2sd_avx512f(auVar8._0_16_,(ulong)(~local_54 + in_ECX));
    auVar8 = ZEXT1664(auVar2);
    auVar7._0_8_ = pow(auVar1._0_8_,auVar2._0_8_);
    auVar7._8_56_ = extraout_var_00;
    uVar6 = vcvttsd2usi_avx512f(auVar7._0_16_);
    IVar3 = (Index)(local_30 / uVar6);
    local_30 = local_30 - IVar3 * (int)uVar6;
    IVar4 = IndexTools::ActionObservation_to_ActionIndex(IVar3,nrA_00,nrO_00);
    *(Index *)(in_R8 + (ulong)local_54 * 4) = IVar4;
    IVar3 = IndexTools::ActionObservation_to_ObservationIndex(IVar3,nrA_00,nrO_00);
    *(Index *)(in_R9 + (ulong)local_54 * 4) = IVar3;
  }
  return;
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetActionObservationHistoryArrays
    (Index agentI, Index aohI, Index t,  Index aIs[], Index oIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //observation-histories.
    Index aohIwithinThisT = aohI - CastLIndexToIndex(_m_firstAOHIforT.at(agentI).at(t));
   
    Index remainder = aohIwithinThisT;
    size_t vec_size = t; // the number of 'JAO' we are searching
        
    size_t nrO = GetNrObservations(agentI);
    size_t nrA = GetNrActions(agentI);
    size_t nrAO = nrO*nrA;
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // for explanation see GetJointActionObservationHistoryArrays()
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrAO, (double)(stage));

        Index aoI_t2 = remainder / b;
        remainder -= aoI_t2 * b;

        aIs[t2] = IndexTools::
            ActionObservation_to_ActionIndex(aoI_t2, nrA, nrO);
        oIs[t2] = IndexTools::
            ActionObservation_to_ObservationIndex(aoI_t2, nrA, nrO);
    }

}